

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

int png_check_fp_number(png_const_charp string,png_size_t size,int *statep,png_size_tp whereami)

{
  byte *pbVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 uVar5;
  uint uVar6;
  int *piVar7;
  char *pcVar8;
  uint uVar9;
  undefined *puVar10;
  long unaff_RBP;
  long *plVar11;
  long *plVar12;
  uint uVar13;
  bool bVar14;
  char in_AF;
  
  uVar9 = *statep;
  piVar7 = (int *)(ulong)uVar9;
  plVar11 = (long *)*whereami;
  plVar12 = plVar11;
  if (plVar11 < size) {
    do {
      plVar12 = plVar11;
      switch(string[(long)plVar11]) {
      case '+':
        uVar9 = 4;
        break;
      case ',':
      case '/':
      case ':':
      case ';':
      case '<':
      case '=':
      case '>':
      case '?':
      case '@':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
        goto switchD_002bcc8f_caseD_2c;
      case '-':
        uVar9 = 0x84;
        break;
      case '.':
        uVar9 = 0x10;
        break;
      case '0':
        uVar9 = 8;
        break;
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        uVar9 = 0x108;
        break;
      case 'E':
        goto switchD_002bcc8f_caseD_45;
      default:
        if (string[(long)plVar11] != 'e') goto switchD_002bcc8f_caseD_2c;
switchD_002bcc8f_caseD_45:
        uVar9 = 0x20;
      }
      uVar6 = (uint)piVar7;
      iVar2 = (uVar9 & 0x3c) + (uVar6 & 3);
      uVar13 = iVar2 - 4;
      if (uVar13 < 0xd) {
        bVar14 = 0xffffffffffccab83 < (ulong)(long)*(int *)(&DAT_0033547c + (ulong)uVar13 * 4);
        puVar10 = &DAT_0033547c + *(int *)(&DAT_0033547c + (ulong)uVar13 * 4);
        switch(iVar2) {
        case 4:
          *piVar7 = *piVar7 + uVar6;
          uVar9 = in(0xff);
          *plVar11 = *plVar11 + (ulong)uVar9;
          return uVar9;
        case 6:
          out(*(undefined4 *)size,(short)statep);
          out(*(undefined1 *)(size + 4),(short)statep);
          *(byte *)((long)whereami + 0x6e) =
               *(byte *)((long)whereami + 0x6e) & (byte)((ulong)whereami >> 8);
          pbVar1 = (byte *)((long)piVar7 + 0x6e);
          *pbVar1 = *pbVar1 & (byte)((ulong)statep >> 8);
          if (*pbVar1 == 0) {
            halt_baddata();
          }
          halt_baddata();
        case 7:
          if (bVar14 || puVar10 == (undefined *)0x0) {
            *(uint *)string = *(uint *)string >> 1 | (uint)((*(uint *)string & 1) != 0) << 0x1f;
            halt_baddata();
          }
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)((long)whereami + -0xf47f652);
          auVar4._8_8_ = statep;
          auVar4._0_8_ = piVar7;
          uVar5 = SUB161(auVar4 / auVar3,0);
          pcVar8 = (char *)(CONCAT71((int7)(CONCAT62(SUB166(auVar4 / auVar3,2),
                                                     CONCAT11((((long)puVar10 < 0) << 7 |
                                                               (puVar10 == (undefined *)0x0) << 6 |
                                                               in_AF << 4 |
                                                               ((POPCOUNT((ulong)puVar10 & 0xff) &
                                                                1U) == 0) << 2 | 2U | bVar14) +
                                                              *(char *)((long)whereami + -0x75c033cd
                                                                       ) + bVar14,uVar5)) >> 8),
                                     uVar5) & 0xffffffffffffff93);
          *pcVar8 = *pcVar8 + (char)pcVar8;
          *pcVar8 = *pcVar8 + (char)pcVar8;
          halt_baddata();
        }
        if (SCARRY1((char)piVar7,'\0') != (char)piVar7 < '\0') {
          uRamc000044a34fff3b6 = uVar6;
          (**(code **)((long)piVar7 + 0x4a))(string,(uint)size ^ *(uint *)(unaff_RBP + 0x4a04fff3));
          do {
          } while( true );
        }
        *(int *)((long)piVar7 + 0x4b) = *(int *)((long)piVar7 + 0x4b) + 1;
        halt_baddata();
      }
      uVar9 = uVar9 & 0x3c | uVar6 & 3;
      if (((uVar9 != 0x20) && (uVar9 != 0x21)) || (((ulong)piVar7 & 8) == 0))
      goto switchD_002bcc8f_caseD_2c;
      piVar7 = (int *)(ulong)(uVar6 & 0x1c0 | 2);
      plVar11 = (long *)((long)plVar11 + 1);
      plVar12 = (long *)size;
      if ((long *)size == plVar11) goto switchD_002bcc8f_caseD_2c;
    } while( true );
  }
LAB_002bcd87:
  *statep = uVar9;
  *whereami = (png_size_t)plVar12;
  return uVar9 >> 3 & 1;
switchD_002bcc8f_caseD_2c:
  uVar9 = (uint)piVar7;
  goto LAB_002bcd87;
}

Assistant:

int /* PRIVATE */
png_check_fp_number(png_const_charp string, png_size_t size, int *statep,
    png_size_tp whereami)
{
   int state = *statep;
   png_size_t i = *whereami;

   while (i < size)
   {
      int type;
      /* First find the type of the next character */
      switch (string[i])
      {
      case 43:  type = PNG_FP_SAW_SIGN;                   break;
      case 45:  type = PNG_FP_SAW_SIGN + PNG_FP_NEGATIVE; break;
      case 46:  type = PNG_FP_SAW_DOT;                    break;
      case 48:  type = PNG_FP_SAW_DIGIT;                  break;
      case 49: case 50: case 51: case 52:
      case 53: case 54: case 55: case 56:
      case 57:  type = PNG_FP_SAW_DIGIT + PNG_FP_NONZERO; break;
      case 69:
      case 101: type = PNG_FP_SAW_E;                      break;
      default:  goto PNG_FP_End;
      }

      /* Now deal with this type according to the current
       * state, the type is arranged to not overlap the
       * bits of the PNG_FP_STATE.
       */
      switch ((state & PNG_FP_STATE) + (type & PNG_FP_SAW_ANY))
      {
      case PNG_FP_INTEGER + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, type);
         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DOT:
         /* Ok as trailer, ok as lead of fraction. */
         if ((state & PNG_FP_SAW_DOT) != 0) /* two dots */
            goto PNG_FP_End;

         else if ((state & PNG_FP_SAW_DIGIT) != 0) /* trailing dot? */
            png_fp_add(state, type);

         else
            png_fp_set(state, PNG_FP_FRACTION | type);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DIGIT:
         if ((state & PNG_FP_SAW_DOT) != 0) /* delayed fraction */
            png_fp_set(state, PNG_FP_FRACTION | PNG_FP_SAW_DOT);

         png_fp_add(state, type | PNG_FP_WAS_VALID);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_E:
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

   /* case PNG_FP_FRACTION + PNG_FP_SAW_SIGN:
         goto PNG_FP_End; ** no sign in fraction */

   /* case PNG_FP_FRACTION + PNG_FP_SAW_DOT:
         goto PNG_FP_End; ** Because SAW_DOT is always set */

      case PNG_FP_FRACTION + PNG_FP_SAW_DIGIT:
         png_fp_add(state, type | PNG_FP_WAS_VALID);
         break;

      case PNG_FP_FRACTION + PNG_FP_SAW_E:
         /* This is correct because the trailing '.' on an
          * integer is handled above - so we can only get here
          * with the sequence ".E" (with no preceding digits).
          */
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

      case PNG_FP_EXPONENT + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, PNG_FP_SAW_SIGN);

         break;

   /* case PNG_FP_EXPONENT + PNG_FP_SAW_DOT:
         goto PNG_FP_End; */

      case PNG_FP_EXPONENT + PNG_FP_SAW_DIGIT:
         png_fp_add(state, PNG_FP_SAW_DIGIT | PNG_FP_WAS_VALID);

         break;

   /* case PNG_FP_EXPONEXT + PNG_FP_SAW_E:
         goto PNG_FP_End; */

      default: goto PNG_FP_End; /* I.e. break 2 */
      }

      /* The character seems ok, continue. */
      ++i;
   }

PNG_FP_End:
   /* Here at the end, update the state and return the correct
    * return code.
    */
   *statep = state;
   *whereami = i;

   return (state & PNG_FP_SAW_DIGIT) != 0;
}